

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

int rtosc_count_printed_arg_vals(char *src)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  char cVar6;
  int skipped_now;
  int local_3c;
  int local_38;
  int local_34;
  
  cVar6 = *src;
  do {
    if (cVar6 == '\0') {
LAB_00114b6a:
      local_3c = 0;
      iVar1 = 0;
      pcVar5 = (char *)0x0;
      do {
        if (*src == '\0') {
          return iVar1;
        }
        if (*src == '/') {
          return iVar1;
        }
        pcVar3 = rtosc_skip_next_printed_arg(src,&local_3c,(char *)0x0,pcVar5,1,0);
        if (pcVar3 == (char *)0x0) {
          return -(iVar1 + local_3c);
        }
        cVar6 = *pcVar3;
        while (cVar6 != '\0') {
          iVar2 = isspace((int)cVar6);
          if (iVar2 == 0) {
            ppuVar4 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar4 + (long)cVar6 * 2 + 1) & 0x20) == 0) {
              while (cVar6 == '%') {
                local_34 = 0;
                __isoc99_sscanf(pcVar3,"%*[^\n] %n",&local_34);
                cVar6 = pcVar3[local_34];
                pcVar3 = pcVar3 + local_34;
              }
            }
            break;
          }
          pcVar5 = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
          cVar6 = *pcVar5;
        }
        iVar1 = iVar1 + local_3c;
        pcVar5 = src;
        src = pcVar3;
      } while( true );
    }
    iVar1 = isspace((int)cVar6);
    if (iVar1 == 0) {
      if (cVar6 == '%') {
        pcVar5 = src;
        do {
          local_38 = 0;
          __isoc99_sscanf(pcVar5,"%*[^\n] %n",&local_38);
          src = pcVar5 + local_38;
          pcVar3 = pcVar5 + local_38;
          pcVar5 = src;
        } while (*pcVar3 == '%');
      }
      goto LAB_00114b6a;
    }
    cVar6 = src[1];
    src = src + 1;
  } while( true );
}

Assistant:

int rtosc_count_printed_arg_vals(const char* src)
{
    int num = 0;

    skip_while(&src, isspace);
    while (*src == '%')
        skip_fmt(&src, "%*[^\n] %n");

    int skipped_now = 0;
    const char* recent_src = NULL;
    for(; src && *src && *src != '/'; num += skipped_now)
    {
        const char* newsrc = rtosc_skip_next_printed_arg(src, &skipped_now,
                                                         NULL, recent_src, 1,
                                                         0);
        recent_src = src;
        src = newsrc;

        if(src) // no parse error
        {
            skip_while(&src, isspace);
            if(*src && !isspace(*src))
            {
                while (*src == '%')
                    skip_fmt(&src, "%*[^\n] %n");
            }
        }
    }
    return src ? num : -num;
}